

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

QArrayDataPointer<QNetworkCookie> * __thiscall
QArrayDataPointer<QNetworkCookie>::operator=
          (QArrayDataPointer<QNetworkCookie> *this,QArrayDataPointer<QNetworkCookie> *other)

{
  QArrayDataPointer<QNetworkCookie> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QNetworkCookie> tmp;
  QArrayDataPointer<QNetworkCookie> *this_00;
  QArrayDataPointer<QNetworkCookie> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.size = -0x5555555555555556;
  local_28.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_28.ptr = (QNetworkCookie *)0xaaaaaaaaaaaaaaaa;
  this_00 = &local_28;
  QArrayDataPointer(this_00,in_RDI);
  swap(this_00,in_RDI);
  ~QArrayDataPointer(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QArrayDataPointer &operator=(const QArrayDataPointer &other) noexcept
    {
        QArrayDataPointer tmp(other);
        this->swap(tmp);
        return *this;
    }